

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

void rtosc_v2argvals(rtosc_arg_val_t *args,size_t nargs,char *arg_str,__va_list_tag *ap)

{
  undefined1 *in_RDX;
  ulong in_RSI;
  undefined1 *in_RDI;
  size_t i;
  rtosc_va_list_t ap2;
  ulong local_40;
  undefined1 *local_18;
  undefined1 *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_40 = 0; local_40 < in_RSI; local_40 = local_40 + 1) {
    *local_8 = *local_18;
    rtosc_v2args((rtosc_arg_t *)arg_str,(size_t)ap,(char *)ap2.a[0].reg_save_area,
                 (rtosc_va_list_t *)ap2.a[0].overflow_arg_area);
    local_18 = local_18 + 1;
    local_8 = local_8 + 0x18;
  }
  return;
}

Assistant:

void rtosc_v2argvals(rtosc_arg_val_t *args,
                     size_t           nargs,
                     const char     * arg_str,
                     va_list          ap)
{
    rtosc_va_list_t ap2;
    va_copy(ap2.a, ap);
    for(size_t i=0; i<nargs; ++i, ++arg_str, ++args)
    {
        args->type = *arg_str;
        rtosc_v2args(&args->val, 1, arg_str, &ap2);
    }
    va_end(ap2.a);
}